

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_48 [44];
  uint i;
  string *s_local;
  uint indentLevel_local;
  uint prettyIndent_local;
  UniValue *this_local;
  
  unique0x10000166 = s;
  s_local._0_4_ = indentLevel;
  s_local._4_4_ = prettyIndent;
  _indentLevel_local = this;
  std::__cxx11::string::operator+=((string *)s,"[");
  if (s_local._4_4_ != 0) {
    std::__cxx11::string::operator+=((string *)stack0xffffffffffffffe0,"\n");
  }
  local_48._36_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(uint)local_48._36_4_;
    sVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::size(&this->values);
    if (sVar2 <= uVar1) break;
    if (s_local._4_4_ != 0) {
      indentStr(s_local._4_4_,(uint)s_local,stack0xffffffffffffffe0);
    }
    pvVar3 = std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
                       (&this->values,(ulong)(uint)local_48._36_4_);
    write_abi_cxx11_((UniValue *)local_48,(int)pvVar3,(void *)(ulong)s_local._4_4_,
                     (ulong)((uint)s_local + 1));
    std::__cxx11::string::operator+=((string *)stack0xffffffffffffffe0,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    uVar1 = (ulong)(uint)local_48._36_4_;
    sVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::size(&this->values);
    if (uVar1 != sVar2 - 1) {
      std::__cxx11::string::operator+=((string *)stack0xffffffffffffffe0,",");
    }
    if (s_local._4_4_ != 0) {
      std::__cxx11::string::operator+=((string *)stack0xffffffffffffffe0,"\n");
    }
    local_48._36_4_ = local_48._36_4_ + 1;
  }
  if (s_local._4_4_ != 0) {
    indentStr(s_local._4_4_,(uint)s_local - 1,stack0xffffffffffffffe0);
  }
  std::__cxx11::string::operator+=((string *)stack0xffffffffffffffe0,"]");
  return;
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}